

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

LongLong __thiscall
cmsys::SystemInformationImplementation::GetProcessId(SystemInformationImplementation *this)

{
  __pid_t _Var1;
  SystemInformationImplementation *this_local;
  
  _Var1 = getpid();
  return (long)_Var1;
}

Assistant:

SystemInformation::LongLong
SystemInformationImplementation::GetProcessId()
{
#if defined(_WIN32)
  return GetCurrentProcessId();
#elif defined(__linux) || defined(__APPLE__)
  return getpid();
#else
  return -1;
#endif
}